

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diyfp.h
# Opt level: O2

void __thiscall
rapidjson::internal::DiyFp::NormalizedBoundaries(DiyFp *this,DiyFp *minus,DiyFp *plus)

{
  int iVar1;
  uint64_t uVar2;
  long lVar3;
  DiyFp DVar4;
  DiyFp local_30;
  
  local_30.f = this->f * 2 + 1;
  local_30.e = this->e + -1;
  DVar4 = NormalizeBoundary(&local_30);
  uVar2 = this->f;
  lVar3 = 0x3fffffffffffff;
  if (uVar2 != 0x10000000000000) {
    lVar3 = uVar2 * 2 + -1;
  }
  iVar1 = this->e;
  plus->f = DVar4.f;
  plus->e = DVar4.e;
  minus->f = lVar3 << ((~(uVar2 == 0x10000000000000) + (char)iVar1) - (char)DVar4.e & 0x3fU);
  minus->e = DVar4.e;
  return;
}

Assistant:

void NormalizedBoundaries(DiyFp* minus, DiyFp* plus) const {
        DiyFp pl = DiyFp((f << 1) + 1, e - 1).NormalizeBoundary();
        DiyFp mi = (f == kDpHiddenBit) ? DiyFp((f << 2) - 1, e - 2) : DiyFp((f << 1) - 1, e - 1);
        mi.f <<= mi.e - pl.e;
        mi.e = pl.e;
        *plus = pl;
        *minus = mi;
    }